

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rans_symbol_encoder.h
# Opt level: O2

bool __thiscall
draco::RAnsSymbolEncoder<16>::EncodeTable(RAnsSymbolEncoder<16> *this,EncoderBuffer *buffer)

{
  uint uVar1;
  pointer prVar2;
  uint32_t i;
  uint uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  uchar local_3b;
  uchar local_3a;
  byte local_39;
  RAnsSymbolEncoder<16> *local_38;
  
  EncodeVarint<unsigned_int>(this->num_symbols_,buffer);
  local_38 = this;
  for (uVar3 = 0; uVar3 < this->num_symbols_; uVar3 = uVar3 + 1) {
    prVar2 = (this->probability_table_).
             super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar1 = prVar2[uVar3].prob;
    if (uVar1 < 0x40) {
      iVar5 = 0;
      if (uVar1 != 0) goto LAB_00181dac;
      lVar6 = 0;
      do {
        if (lVar6 == 0x3f) {
          iVar5 = 0x3f;
          goto LAB_00181e1b;
        }
        iVar5 = (int)lVar6;
        lVar6 = lVar6 + 1;
      } while (prVar2[uVar3 + 1 + iVar5].prob == 0);
      iVar5 = (int)lVar6 + -1;
LAB_00181e1b:
      local_39 = (char)iVar5 * '\x04' | 3;
      EncoderBuffer::Encode<unsigned_char>(buffer,&local_39);
      uVar3 = uVar3 + iVar5;
    }
    else {
      iVar5 = 1;
      if ((0x3fff < uVar1) && (iVar5 = 2, 0x3fffff < uVar1)) break;
LAB_00181dac:
      local_3a = (char)iVar5 + (char)uVar1 * '\x04';
      EncoderBuffer::Encode<unsigned_char>(buffer,&local_3a);
      for (iVar4 = 0; this = local_38, iVar5 << 3 != iVar4; iVar4 = iVar4 + 8) {
        local_3b = (uchar)(uVar1 >> ((char)iVar4 + 6U & 0x1f));
        EncoderBuffer::Encode<unsigned_char>(buffer,&local_3b);
      }
    }
  }
  return this->num_symbols_ <= uVar3;
}

Assistant:

bool RAnsSymbolEncoder<unique_symbols_bit_length_t>::EncodeTable(
    EncoderBuffer *buffer) {
  EncodeVarint(num_symbols_, buffer);
  // Use varint encoding for the probabilities (first two bits represent the
  // number of bytes used - 1).
  for (uint32_t i = 0; i < num_symbols_; ++i) {
    const uint32_t prob = probability_table_[i].prob;
    int num_extra_bytes = 0;
    if (prob >= (1 << 6)) {
      num_extra_bytes++;
      if (prob >= (1 << 14)) {
        num_extra_bytes++;
        if (prob >= (1 << 22)) {
          // The maximum number of precision bits is 20 so we should not really
          // get to this point.
          return false;
        }
      }
    }
    if (prob == 0) {
      // When the probability of the symbol is 0, set the first two bits to 1
      // (unique identifier) and use the remaining 6 bits to store the offset
      // to the next symbol with non-zero probability.
      uint32_t offset = 0;
      for (; offset < (1 << 6) - 1; ++offset) {
        // Note: we don't have to check whether the next symbol id is larger
        // than num_symbols_ because we know that the last symbol always has
        // non-zero probability.
        const uint32_t next_prob = probability_table_[i + offset + 1].prob;
        if (next_prob > 0) {
          break;
        }
      }
      buffer->Encode(static_cast<uint8_t>((offset << 2) | 3));
      i += offset;
    } else {
      // Encode the first byte (including the number of extra bytes).
      buffer->Encode(static_cast<uint8_t>((prob << 2) | (num_extra_bytes & 3)));
      // Encode the extra bytes.
      for (int b = 0; b < num_extra_bytes; ++b) {
        buffer->Encode(static_cast<uint8_t>(prob >> (8 * (b + 1) - 2)));
      }
    }
  }
  return true;
}